

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_point_triangle(rf_vec2 point,rf_vec2 p1,rf_vec2 p2,rf_vec2 p3)

{
  float fVar1;
  float fVar2;
  float gamma;
  float beta;
  float alpha;
  float fStack_24;
  _Bool collision;
  rf_vec2 p3_local;
  rf_vec2 p2_local;
  rf_vec2 p1_local;
  rf_vec2 point_local;
  
  beta._3_1_ = false;
  p3_local.y = p2.y;
  fStack_24 = p3.y;
  p1_local.x = point.x;
  alpha = p3.x;
  p3_local.x = p2.x;
  p1_local.y = point.y;
  p2_local.x = p1.x;
  p2_local.y = p1.y;
  fVar1 = ((p3_local.y - fStack_24) * (p1_local.x - alpha) +
          (alpha - p3_local.x) * (p1_local.y - fStack_24)) /
          ((p3_local.y - fStack_24) * (p2_local.x - alpha) +
          (alpha - p3_local.x) * (p2_local.y - fStack_24));
  fVar2 = ((fStack_24 - p2_local.y) * (p1_local.x - alpha) +
          (p2_local.x - alpha) * (p1_local.y - fStack_24)) /
          ((p3_local.y - fStack_24) * (p2_local.x - alpha) +
          (alpha - p3_local.x) * (p2_local.y - fStack_24));
  if ((0.0 < fVar1) && (0.0 < fVar2 && 0.0 < (1.0 - fVar1) - fVar2)) {
    beta._3_1_ = true;
  }
  return beta._3_1_;
}

Assistant:

bool rf_check_collision_point_triangle(rf_vec2 point, rf_vec2 p1, rf_vec2 p2, rf_vec2 p3)
{
    bool collision = 0;

    float alpha = ((p2.y - p3.y) * (point.x - p3.x) + (p3.x - p2.x) * (point.y - p3.y)) /
                  ((p2.y - p3.y) * (p1.x - p3.x) + (p3.x - p2.x) * (p1.y - p3.y));

    float beta = ((p3.y - p1.y) * (point.x - p3.x) + (p1.x - p3.x) * (point.y - p3.y)) /
                 ((p2.y - p3.y) * (p1.x - p3.x) + (p3.x - p2.x) * (p1.y - p3.y));

    float gamma = 1.0f - alpha - beta;

    if ((alpha > 0) && (beta > 0) & (gamma > 0)) collision = 1;

    return collision;
}